

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_error_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSStackFrame *pJVar1;
  JSValue JVar2;
  JSValue *pJVar3;
  int iVar4;
  JSContext *pJVar5;
  JSValueUnion JVar6;
  JSValueUnion *pJVar7;
  ulong uVar8;
  int64_t iVar9;
  long idx;
  ulong uVar10;
  JSRefCountHeader *p;
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue method;
  JSValue val_00;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffff9c;
  JSValueUnion JVar18;
  int64_t local_50;
  int local_34;
  
  iVar9 = new_target.tag;
  JVar18 = new_target.u;
  if ((int)new_target.tag == 3) {
    pJVar1 = ctx->rt->current_stack_frame;
    JVar18 = (JSValueUnion)(pJVar1->cur_func).u.ptr;
    iVar9 = (pJVar1->cur_func).tag;
  }
  JVar11.tag = iVar9;
  JVar11.u.ptr = JVar18.ptr;
  JVar15.tag = iVar9;
  JVar15.u.ptr = JVar18.ptr;
  JVar11 = JS_GetPropertyInternal(ctx,JVar11,0x3b,JVar15,0);
  JVar12 = JVar11;
  if ((int)JVar11.tag == -1) {
LAB_0012b9a1:
    JVar11 = JS_NewObjectProtoClass(ctx,JVar12,3);
    JS_FreeValue(ctx,JVar12);
    if ((int)JVar11.tag != 6) {
      if ((int)argv[magic == 7].tag != 3) {
        val.tag = argv[magic == 7].tag;
        val.u.ptr = argv[magic == 7].u.ptr;
        JVar12 = JS_ToString(ctx,val);
        if ((int)JVar12.tag != 6) {
          JS_DefinePropertyValue(ctx,JVar11,0x33,JVar12,3);
          goto LAB_0012ba2f;
        }
LAB_0012bae5:
        JS_FreeValue(ctx,JVar11);
        goto LAB_0012baf3;
      }
LAB_0012ba2f:
      if (magic == 7) {
        JVar18.float64 = 0.0;
        JVar12 = JS_GetIterator(ctx,*argv,0);
        if ((int)JVar12.tag == 6) {
          JVar13.tag = 3;
          JVar13.u.float64 = JVar18.float64;
LAB_0012ba99:
          JVar15 = (JSValue)(ZEXT816(3) << 0x40);
          uVar8 = 0;
        }
        else {
          uVar17 = 0;
          JVar13 = JS_GetPropertyInternal(ctx,JVar12,0x6a,JVar12,0);
          local_50 = JVar13.tag;
          JVar18 = JVar13.u;
          if ((int)JVar13.tag == 6) goto LAB_0012ba99;
          JVar15 = JS_NewArray(ctx);
          JVar13.tag = local_50;
          JVar13.u.ptr = JVar18.ptr;
          iVar9 = JVar15.tag;
          JVar6 = JVar15.u;
          uVar8 = (ulong)JVar6.ptr >> 0x20;
          if ((int)JVar15.tag != 6) {
            idx = 0;
            do {
              method.tag = local_50;
              method.u.ptr = JVar18.ptr;
              JVar16 = JS_IteratorNext(ctx,JVar12,method,(int)&local_34,
                                       (JSValue *)CONCAT44(in_stack_ffffffffffffff9c,uVar17),
                                       (BOOL *)JVar18.ptr);
              if ((int)JVar16.tag == 6) break;
              if (local_34 != 0) {
                uVar8 = (ulong)JVar6.ptr & 0xffffffff00000000;
                uVar10 = (ulong)JVar6.ptr & 0xffffffff;
                goto LAB_0012babb;
              }
              uVar17 = 0x4007;
              iVar4 = JS_DefinePropertyValueInt64(ctx,JVar15,idx,JVar16,0x4007);
              idx = idx + 1;
            } while (-1 < iVar4);
            JS_IteratorClose(ctx,JVar12,1);
            JVar13.u.ptr = JVar18.ptr;
          }
        }
        local_50 = JVar13.tag;
        JVar18 = JVar13.u;
        v.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar8 << 0x20);
        v.tag = JVar15.tag;
        JS_FreeValue(ctx,v);
        iVar9 = 6;
        uVar10 = 0;
        uVar8 = 0;
LAB_0012babb:
        v_00.tag = local_50;
        v_00.u.float64 = JVar18.float64;
        JS_FreeValue(ctx,v_00);
        JS_FreeValue(ctx,JVar12);
        if ((int)iVar9 == 6) goto LAB_0012bae5;
        val_00.tag = iVar9;
        val_00.u.ptr = (void *)(uVar8 | uVar10);
        JS_DefinePropertyValue(ctx,JVar11,0x34,val_00,3);
      }
      build_backtrace(ctx,JVar11,(char *)0x0,0,1);
    }
LAB_0012bb36:
    uVar8 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
  }
  else {
    if ((int)JVar11.tag == 6) goto LAB_0012bb36;
    JS_FreeValue(ctx,JVar11);
    JVar16.tag = iVar9;
    JVar16.u.ptr = JVar18.ptr;
    pJVar5 = JS_GetFunctionRealm(ctx,JVar16);
    if (pJVar5 != (JSContext *)0x0) {
      if (magic < 0) {
        pJVar7 = &pJVar5->class_proto[3].u;
        pJVar3 = pJVar5->class_proto + 3;
      }
      else {
        pJVar7 = &pJVar5->native_error_proto[(uint)magic].u;
        pJVar3 = pJVar5->native_error_proto + (uint)magic;
      }
      JVar18 = (JSValueUnion)pJVar7->ptr;
      iVar9 = pJVar3->tag;
      JVar2.tag = iVar9;
      JVar2.u.ptr = JVar18.ptr;
      JVar12.tag = iVar9;
      JVar12.u.ptr = JVar18.ptr;
      if (0xfffffff4 < (uint)iVar9) {
        *(int *)JVar18.ptr = *JVar18.ptr + 1;
        JVar12 = JVar2;
      }
      goto LAB_0012b9a1;
    }
LAB_0012baf3:
    uVar8 = 0;
    JVar11 = (JSValue)(ZEXT816(6) << 0x40);
  }
  JVar14.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar8);
  JVar14.tag = JVar11.tag;
  return JVar14;
}

Assistant:

static JSValue js_error_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv, int magic)
{
    JSValue obj, msg, proto;
    JSValueConst message;

    if (JS_IsUndefined(new_target))
        new_target = JS_GetActiveFunction(ctx);
    proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
    if (JS_IsException(proto))
        return proto;
    if (!JS_IsObject(proto)) {
        JSContext *realm;
        JSValueConst proto1;
        
        JS_FreeValue(ctx, proto);
        realm = JS_GetFunctionRealm(ctx, new_target);
        if (!realm)
            return JS_EXCEPTION;
        if (magic < 0) {
            proto1 = realm->class_proto[JS_CLASS_ERROR];
        } else {
            proto1 = realm->native_error_proto[magic];
        }
        proto = JS_DupValue(ctx, proto1);
    }
    obj = JS_NewObjectProtoClass(ctx, proto, JS_CLASS_ERROR);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        return obj;
    if (magic == JS_AGGREGATE_ERROR) {
        message = argv[1];
    } else {
        message = argv[0];
    }

    if (!JS_IsUndefined(message)) {
        msg = JS_ToString(ctx, message);
        if (unlikely(JS_IsException(msg)))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message, msg,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    if (magic == JS_AGGREGATE_ERROR) {
        JSValue error_list = iterator_to_array(ctx, argv[0]);
        if (JS_IsException(error_list))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_errors, error_list,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    /* skip the Error() function in the backtrace */
    build_backtrace(ctx, obj, NULL, 0, JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL);
    return obj;
 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}